

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomDataStatic
               (data_ptr_t data,idx_t len)

{
  void *__dest;
  unsigned_long __n;
  const_data_ptr_t __src;
  unsigned_long in_RSI;
  void *in_RDI;
  unsigned_long next;
  uint32_t random_integer;
  RandomEngine random_engine;
  uint local_4c;
  long local_48;
  RandomEngine local_40 [48];
  unsigned_long local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_48 = duckdb::Timestamp::GetCurrentTimestamp();
  duckdb::RandomEngine::RandomEngine(local_40,local_48);
  for (; local_10 != 0; local_10 = local_10 - __n) {
    local_4c = duckdb::RandomEngine::NextRandomInteger();
    __n = duckdb::MinValue<unsigned_long>(local_10,4);
    __dest = local_8;
    __src = duckdb::const_data_ptr_cast<unsigned_int>(&local_4c);
    memcpy(__dest,__src,__n);
    local_8 = (void *)(__n + (long)local_8);
  }
  duckdb::RandomEngine::~RandomEngine(local_40);
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::GenerateRandomDataStatic(duckdb::data_ptr_t data, duckdb::idx_t len) {
	duckdb::RandomEngine random_engine(duckdb::Timestamp::GetCurrentTimestamp().value);
	while (len != 0) {
		const auto random_integer = random_engine.NextRandomInteger();
		const auto next = duckdb::MinValue<duckdb::idx_t>(len, sizeof(random_integer));
		memcpy(data, duckdb::const_data_ptr_cast(&random_integer), next);
		data += next;
		len -= next;
	}
}